

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  pointer pSVar1;
  long *plVar2;
  Expr<tcu::Vector<float,_4>_> *pEVar3;
  undefined7 uVar4;
  IVal *pIVar5;
  size_t ndx;
  ulong uVar6;
  double *pdVar7;
  IRet *pIVar8;
  Vector<tcu::Interval,_4> *pVVar9;
  long lVar10;
  byte bVar11;
  Environment funEnv;
  EvalContext funCtx;
  double local_90 [12];
  
  bVar11 = 0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       funEnv.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  initialize(this);
  Environment::bind<tcu::Vector<float,4>>
            (&funEnv,(this->m_var0).
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                     m_ptr,args->a);
  Environment::bind<tcu::Vector<float,4>>
            (&funEnv,(this->m_var1).
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                     m_ptr,args->b);
  Environment::bind<tcu::Vector<float,4>>
            (&funEnv,(this->m_var2).
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                     m_ptr,args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            (&funEnv,(this->m_var3).
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     .m_ptr,args->d);
  funCtx.floatPrecision = ctx->floatPrecision;
  funCtx.callDepth = ctx->callDepth;
  funCtx.format.m_maxValue = (ctx->format).m_maxValue;
  funCtx.format.m_minExp = (ctx->format).m_minExp;
  funCtx.format.m_maxExp = (ctx->format).m_maxExp;
  funCtx.format.m_fractionBits = (ctx->format).m_fractionBits;
  funCtx.format.m_hasSubnormal = (ctx->format).m_hasSubnormal;
  funCtx.format.m_hasInf = (ctx->format).m_hasInf;
  funCtx.format.m_hasNaN = (ctx->format).m_hasNaN;
  funCtx.format.m_exactPrecision = (ctx->format).m_exactPrecision;
  funCtx.format._25_7_ = *(undefined7 *)&(ctx->format).field_0x19;
  lVar10 = 0;
  uVar6 = 0;
  funCtx.env = &funEnv;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar6)
    break;
    plVar2 = *(long **)((long)&(pSVar1->super_SharedPtr<const_vkt::shaderexecutor::Statement>).m_ptr
                       + lVar10);
    (**(code **)(*plVar2 + 0x18))(plVar2,&funCtx);
    uVar6 = uVar6 + 1;
    lVar10 = lVar10 + 0x10;
  }
  pEVar3 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_4>_>.
           super_ExprPBase<tcu::Vector<float,_4>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_4>_>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(local_90,pEVar3,&funCtx);
  pdVar7 = local_90;
  pIVar8 = __return_storage_ptr__;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    *(double *)pIVar8->m_data = *pdVar7;
    pdVar7 = pdVar7 + (ulong)bVar11 * -2 + 1;
    pIVar8 = (IRet *)((long)pIVar8 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     (&funEnv,(this->m_var0).
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
  pVVar9 = args->a;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar4 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar9->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar9->m_data[0].field_0x1 = uVar4;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar9 = (Vector<tcu::Interval,_4> *)((long)pVVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     (&funEnv,(this->m_var1).
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
  pVVar9 = args->b;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar4 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar9->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar9->m_data[0].field_0x1 = uVar4;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar9 = (Vector<tcu::Interval,_4> *)((long)pVVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pIVar5 = Environment::lookup<tcu::Vector<float,4>>
                     (&funEnv,(this->m_var2).
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
  pVVar9 = args->c;
  for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar4 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
    pVVar9->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar9->m_data[0].field_0x1 = uVar4;
    pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar11 * -2 + 1) * 8);
    pVVar9 = (Vector<tcu::Interval,_4> *)((long)pVVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  Environment::lookup<vkt::shaderexecutor::Void>
            (&funEnv,(this->m_var3).
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                     .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&funEnv);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}